

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O0

void __thiscall cmSearchPath::AddPath(cmSearchPath *this,string *path)

{
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *path_local;
  cmSearchPath *this_local;
  
  local_18 = path;
  path_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  AddPathInternal(this,path,&local_38,(char *)0x0);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void cmSearchPath::AddPath(const std::string& path)
{
  this->AddPathInternal(path, "");
}